

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_jsonreport.cpp
# Opt level: O1

int test_jsonreport_escape(ITesting *t)

{
  ResultSummary *this;
  Ref result;
  shared_ptr<trun::TestFunc> tfunc;
  ResultsReportJSON jsonReport;
  string assertErrMsg;
  AssertError assertError;
  undefined1 local_128 [40];
  pointer local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  long local_e8;
  double local_e0 [3];
  undefined2 local_c8;
  undefined1 local_c6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  long local_b0 [2];
  string local_a0;
  string local_80;
  TestResult *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  AssertError local_50;
  
  local_128._16_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trun::TestFunc,std::allocator<trun::TestFunc>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 0x18),
             (TestFunc **)(local_128 + 0x10),(allocator<trun::TestFunc> *)&local_f8);
  local_f8._M_allocated_capacity = (size_type)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"dummy","");
  trun::TestResult::Create((TestResult *)local_128,(string *)&local_f8);
  if ((long *)local_f8._M_allocated_capacity != &local_e8) {
    operator_delete((void *)local_f8._M_allocated_capacity,local_e8 + 1);
  }
  *(kTestResult *)(local_128._0_8_ + 0x41) = kTestResult_TestFail;
  local_50._vptr_AssertError = (_func_int **)&PTR__AssertError_00226700;
  local_50.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0._M_allocated_capacity = (size_type)local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"fopen(\"filename.txt\",\"r\");","");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"dummy.cpp","");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_c0._M_allocated_capacity,
             local_c0._8_8_ + local_c0._M_allocated_capacity);
  trun::AssertError::Add(&local_50,kAssert_Error,0,&local_80,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  trun::TestResult::SetAssertError((TestResult *)local_128._0_8_,&local_50);
  local_60 = (TestResult *)local_128._0_8_;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_;
  if ((pointer)local_128._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((string *)(local_128._8_8_ + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)(local_128._8_8_ + 8))->_M_dataplus)._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((string *)(local_128._8_8_ + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)(local_128._8_8_ + 8))->_M_dataplus)._M_p + 1;
    }
  }
  *(undefined8 *)((long)&(((pointer)(local_128._16_8_ + 0x90))->file).field_2 + 8) = local_128._0_8_
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &((pointer)(local_128._16_8_ + 0x90))->message,&local_58);
  if ((pointer)local_58._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  this = trun::ResultSummary::Instance();
  local_128._32_8_ = local_128._16_8_;
  local_100 = (pointer)local_128._24_8_;
  if ((pointer)local_128._24_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((string *)(local_128._24_8_ + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)(local_128._24_8_ + 8))->_M_dataplus)._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((string *)(local_128._24_8_ + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)(local_128._24_8_ + 8))->_M_dataplus)._M_p + 1;
    }
  }
  trun::ResultSummary::AddResult(this,(Ref *)(local_128 + 0x20));
  if (local_100 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100);
  }
  trun::ResultsReportPinterBase::ResultsReportPinterBase((ResultsReportPinterBase *)&local_f8);
  local_f8._M_allocated_capacity = (size_type)&PTR__ResultsReportPinterBase_00226b08;
  local_c8 = 0;
  local_c6 = 0;
  trun::ResultsReportJSON::Begin((ResultsReportJSON *)&local_f8);
  trun::ResultsReportJSON::PrintReport((ResultsReportJSON *)&local_f8);
  trun::ResultsReportJSON::End((ResultsReportJSON *)&local_f8);
  local_f8._M_allocated_capacity = (size_type)&PTR__ResultsReportPinterBase_002267d0;
  if ((double *)local_f8._8_8_ != local_e0) {
    operator_delete((void *)local_f8._8_8_,(long)local_e0[0] + 1);
  }
  if ((long *)local_c0._M_allocated_capacity != local_b0) {
    operator_delete((void *)local_c0._M_allocated_capacity,local_b0[0] + 1);
  }
  local_50._vptr_AssertError = (_func_int **)&PTR__AssertError_00226700;
  std::
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>::
  ~vector(&local_50.assertErrors);
  if ((pointer)local_128._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
  }
  if ((pointer)local_128._24_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._24_8_);
  }
  return 0;
}

Assistant:

DLL_EXPORT int test_jsonreport_escape(ITesting *t) {
    auto tfunc = std::make_shared<trun::TestFunc>();
    auto result = trun::TestResult::Create("dummy");
    result->SetResult(trun::kTestResult_TestFail);
    trun::AssertError assertError;
    auto assertErrMsg = std::string("fopen(\"filename.txt\",\"r\");");
    assertError.Add(trun::AssertError::kAssert_Error, 0, "dummy.cpp", assertErrMsg);
    result->SetAssertError(assertError);

    tfunc->SetResultFromSubProcess(result);

    // Add this to the global result summary instance
    trun::ResultSummary::Instance().AddResult(tfunc);

    trun::ResultsReportJSON jsonReport;
    jsonReport.Begin();
    jsonReport.PrintReport();
    jsonReport.End();

    // I don't really have an interface to deal with testing the result without loading and doing shit..
    // this is verified through visual inspection of the result!

    return kTR_Pass;
}